

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O3

void __thiscall
pstd::pmr::monotonic_buffer_resource::~monotonic_buffer_resource(monotonic_buffer_resource *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  (this->super_memory_resource)._vptr_memory_resource =
       (_func_int **)&PTR__monotonic_buffer_resource_031e58c0;
  release(this);
  p_Var2 = (this->availableBlocks).
           super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)&this->availableBlocks) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2,0x20);
    p_Var2 = p_Var1;
  }
  p_Var2 = (this->usedBlocks).
           super__List_base<pstd::pmr::monotonic_buffer_resource::MemoryBlock,_std::allocator<pstd::pmr::monotonic_buffer_resource::MemoryBlock>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)&this->usedBlocks) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2,0x20);
    p_Var2 = p_Var1;
  }
  memory_resource::~memory_resource(&this->super_memory_resource);
  return;
}

Assistant:

~monotonic_buffer_resource() { release(); }